

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O0

int aom_free_frame_buffer(YV12_BUFFER_CONFIG *ybf)

{
  void *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = 2;
  }
  else {
    if (*(long *)((long)in_RDI + 0x78) != 0) {
      aom_free(in_RDI);
    }
    if (*(long *)((long)in_RDI + 0x60) != 0) {
      aom_free_pyramid((ImagePyramid *)0x69bbf5);
    }
    if (*(long *)((long)in_RDI + 0x68) != 0) {
      av1_free_corner_list((CornerList *)0x69bc0f);
    }
    aom_remove_metadata_from_frame_buffer((YV12_BUFFER_CONFIG *)0x69bc19);
    memset(in_RDI,0,0xd0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_free_frame_buffer(YV12_BUFFER_CONFIG *ybf) {
  if (ybf) {
    if (ybf->buffer_alloc_sz > 0) {
      aom_free(ybf->buffer_alloc);
    }
#if CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    if (ybf->y_pyramid) {
      aom_free_pyramid(ybf->y_pyramid);
    }
    if (ybf->corners) {
      av1_free_corner_list(ybf->corners);
    }
#endif  // CONFIG_AV1_ENCODER && !CONFIG_REALTIME_ONLY
    aom_remove_metadata_from_frame_buffer(ybf);
    /* buffer_alloc isn't accessed by most functions.  Rather y_buffer,
      u_buffer and v_buffer point to buffer_alloc and are used.  Clear out
      all of this so that a freed pointer isn't inadvertently used */
    memset(ybf, 0, sizeof(YV12_BUFFER_CONFIG));
    return 0;
  }

  return AOM_CODEC_MEM_ERROR;
}